

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *u;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  SPxOut *pSVar2;
  int iVar3;
  long lVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  uint *puVar6;
  SPxId enterId;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_1b8;
  undefined4 local_1ac;
  cpp_dec_float<200U,_int,_void> local_1a8;
  cpp_dec_float<200U,_int,_void> local_128;
  uint local_a0 [28];
  int local_30;
  undefined1 local_2c;
  undefined8 local_28;
  
  local_1b8.info = 0;
  local_1b8.idx = -1;
  u = &(this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance;
  pnVar5 = u;
  puVar6 = local_a0;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar5->m_backend).data._M_elems + 1);
    puVar6 = puVar6 + 1;
  }
  local_30 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.exp;
  local_2c = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.neg;
  local_28._0_4_ =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_28._4_4_ =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  local_1b8 = (DataKey)selectEnterX(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)local_a0);
  if (0 < local_1b8.info) {
    pSVar1 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    SPxColId::SPxColId((SPxColId *)&local_1a8,(SPxId *)&local_1b8);
    iVar3 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(pSVar1->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)&local_1a8);
    if (0 < pSVar1->theRep *
            (pSVar1->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.colstat.data[iVar3]) {
      local_1b8 = (DataKey)((ulong)local_1b8 & 0xffffffff00000000);
    }
  }
  if (local_1b8.info < 0) {
    pSVar1 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    SPxRowId::SPxRowId((SPxRowId *)&local_1a8,(SPxId *)&local_1b8);
    iVar3 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(pSVar1->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)&local_1a8);
    if (0 < pSVar1->theRep *
            (pSVar1->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thedesc.rowstat.data[iVar3]) {
      local_1b8 = (DataKey)((ulong)local_1b8 & 0xffffffff00000000);
    }
  }
  if ((local_1b8.info == 0) && (this->refined == false)) {
    this->refined = true;
    pSVar2 = ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
      local_1a8.data._M_elems[0] = pSVar2->m_verbosity;
      local_1ac = 5;
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = ((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity],"WDEVEX02 trying refinement step..\n",0x22);
      pSVar2 = ((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->spxout;
      (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_1a8);
    }
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x1c;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems[0xe] = 0;
    local_128.data._M_elems[0xf] = 0;
    local_128.data._M_elems[0x10] = 0;
    local_128.data._M_elems[0x11] = 0;
    local_128.data._M_elems[0x12] = 0;
    local_128.data._M_elems[0x13] = 0;
    local_128.data._M_elems[0x14] = 0;
    local_128.data._M_elems[0x15] = 0;
    local_128.data._M_elems[0x16] = 0;
    local_128.data._M_elems[0x17] = 0;
    local_128.data._M_elems[0x18] = 0;
    local_128.data._M_elems[0x19] = 0;
    local_128.data._M_elems._104_5_ = 0;
    local_128.data._M_elems[0x1b]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    local_1a8.fpclass = cpp_dec_float_finite;
    local_1a8.prec_elem = 0x1c;
    local_1a8.data._M_elems[0] = 0;
    local_1a8.data._M_elems[1] = 0;
    local_1a8.data._M_elems[2] = 0;
    local_1a8.data._M_elems[3] = 0;
    local_1a8.data._M_elems[4] = 0;
    local_1a8.data._M_elems[5] = 0;
    local_1a8.data._M_elems[6] = 0;
    local_1a8.data._M_elems[7] = 0;
    local_1a8.data._M_elems[8] = 0;
    local_1a8.data._M_elems[9] = 0;
    local_1a8.data._M_elems[10] = 0;
    local_1a8.data._M_elems[0xb] = 0;
    local_1a8.data._M_elems[0xc] = 0;
    local_1a8.data._M_elems[0xd] = 0;
    local_1a8.data._M_elems[0xe] = 0;
    local_1a8.data._M_elems[0xf] = 0;
    local_1a8.data._M_elems[0x10] = 0;
    local_1a8.data._M_elems[0x11] = 0;
    local_1a8.data._M_elems[0x12] = 0;
    local_1a8.data._M_elems[0x13] = 0;
    local_1a8.data._M_elems[0x14] = 0;
    local_1a8.data._M_elems[0x15] = 0;
    local_1a8.data._M_elems[0x16] = 0;
    local_1a8.data._M_elems[0x17] = 0;
    local_1a8.data._M_elems[0x18] = 0;
    local_1a8.data._M_elems[0x19] = 0;
    local_1a8.data._M_elems._104_5_ = 0;
    local_1a8.data._M_elems[0x1b]._1_3_ = 0;
    local_1a8.exp = 0;
    local_1a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_1a8,2.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_128,&u->m_backend,&local_1a8);
    local_1b8 = (DataKey)selectEnterX(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&local_128);
    if (0 < local_1b8.info) {
      pSVar1 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      SPxColId::SPxColId((SPxColId *)&local_1a8,(SPxId *)&local_1b8);
      iVar3 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
              ::number(&(pSVar1->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set,(DataKey *)&local_1a8);
      if (0 < pSVar1->theRep *
              (pSVar1->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data[iVar3]) {
        local_1b8 = (DataKey)((ulong)local_1b8 & 0xffffffff00000000);
      }
    }
    if (local_1b8.info < 0) {
      pSVar1 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      SPxRowId::SPxRowId((SPxRowId *)&local_1a8,(SPxId *)&local_1b8);
      iVar3 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
              ::number(&(pSVar1->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set,(DataKey *)&local_1a8);
      if (0 < pSVar1->theRep *
              (pSVar1->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data[iVar3]) {
        local_1b8 = (DataKey)((ulong)local_1b8 & 0xffffffff00000000);
      }
    }
  }
  return (SPxId)local_1b8;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);

   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
      enterId.info = 0;

   if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
      enterId.info = 0;

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WDEVEX02 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_DEVEX_REFINETOL);

      if(enterId.isSPxColId() && this->thesolver->isBasic(SPxColId(enterId)))
         enterId.info = 0;

      if(enterId.isSPxRowId() && this->thesolver->isBasic(SPxRowId(enterId)))
         enterId.info = 0;
   }

   return enterId;
}